

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall
TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
          (ScriptContextTTD *this,FunctionBody *body,FunctionBody *parent)

{
  NestedArray *pNVar1;
  bool bVar2;
  uint uVar3;
  BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar4;
  ParseableFunctionInfo *pfi;
  FunctionBody *body_00;
  uint32 i;
  uint index;
  FunctionBody *local_28;
  FunctionBody *parent_local;
  FunctionBody *body_local;
  
  local_28 = parent;
  parent_local = body;
  if (parent == (FunctionBody *)0x0) {
    pBVar4 = Memory::
             RecyclerRootPtr<JsUtil::BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->m_ttdPinnedRootFunctionSet);
    bVar2 = JsUtil::
            BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::Contains(pBVar4,&parent_local);
    if (bVar2) {
      TTDAbort_unrecoverable_error("We already added this function!!!");
    }
    pBVar4 = Memory::
             RecyclerRootPtr<JsUtil::BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->m_ttdPinnedRootFunctionSet);
    JsUtil::
    BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::AddNew(pBVar4,&parent_local);
  }
  JsUtil::
  BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
            ((BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->m_ttdFunctionBodyParentMap,&parent_local,&local_28);
  index = 0;
  while( true ) {
    pNVar1 = (parent_local->super_ParseableFunctionInfo).nestedArray.ptr;
    uVar3 = 0;
    if (pNVar1 != (NestedArray *)0x0) {
      uVar3 = pNVar1->nestedCount;
    }
    if (uVar3 <= index) break;
    pfi = Js::ParseableFunctionInfo::GetNestedFunctionForExecution
                    (&parent_local->super_ParseableFunctionInfo,index);
    body_00 = JsSupport::ForceAndGetFunctionBody(pfi);
    ProcessFunctionBodyOnLoad(this,body_00,parent_local);
    index = index + 1;
  }
  return;
}

Assistant:

void ScriptContextTTD::ProcessFunctionBodyOnLoad(Js::FunctionBody* body, Js::FunctionBody* parent)
    {
        //if this is a root (parent is null) then put this in the rootbody pin set so it isn't reclaimed on us
        if(parent == nullptr)
        {
            TTDAssert(!this->m_ttdPinnedRootFunctionSet->Contains(body), "We already added this function!!!");
            this->m_ttdPinnedRootFunctionSet->AddNew(body);
        }

        this->m_ttdFunctionBodyParentMap.AddNew(body, parent);

        for(uint32 i = 0; i < body->GetNestedCount(); ++i)
        {
            Js::ParseableFunctionInfo* pfiMid = body->GetNestedFunctionForExecution(i);
            Js::FunctionBody* currfb = TTD::JsSupport::ForceAndGetFunctionBody(pfiMid);

            this->ProcessFunctionBodyOnLoad(currfb, body);
        }
    }